

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
cnn::GaussianNoise::forward_impl
          (GaussianNoise *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs
          ,Tensor *fx)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  Tensor *pTVar4;
  float *pfVar5;
  float *pfVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  int iVar13;
  uint uVar14;
  Index size;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  Index index_1;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  Tensor m;
  Tensor local_68;
  
  local_68.v = (float *)(this->super_Node).aux_mem;
  local_68.d.bd = (this->super_Node).dim.bd;
  local_68.d.d._0_8_ = *(undefined8 *)(this->super_Node).dim.d;
  local_68.d.d._8_8_ = *(undefined8 *)((this->super_Node).dim.d + 2);
  local_68.d.d._16_8_ = *(undefined8 *)((this->super_Node).dim.d + 4);
  local_68.d._24_8_ = *(undefined8 *)((this->super_Node).dim.d + 6);
  local_68.bs.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.bs.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.bs.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TensorTools::RandomizeNormal(0.0,this->stddev,&local_68);
  pTVar4 = *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar17 = (ulong)(pTVar4->d).nd;
  iVar15 = 1;
  iVar13 = 1;
  if (uVar17 != 0) {
    uVar16 = 0;
    do {
      iVar13 = iVar13 * (pTVar4->d).d[uVar16];
      uVar16 = uVar16 + 1;
    } while (uVar17 != uVar16);
  }
  if ((ulong)local_68.d._24_8_ >> 0x20 != 0) {
    iVar15 = 1;
    uVar17 = 0;
    do {
      iVar15 = iVar15 * local_68.d.d[uVar17];
      uVar17 = uVar17 + 1;
    } while ((ulong)local_68.d._24_8_ >> 0x20 != uVar17);
  }
  if (iVar13 * (pTVar4->d).bd == iVar15 * local_68.d.bd) {
    uVar17 = (ulong)(fx->d).nd;
    iVar13 = 1;
    if (uVar17 != 0) {
      uVar16 = 0;
      do {
        iVar13 = iVar13 * (fx->d).d[uVar16];
        uVar16 = uVar16 + 1;
      } while (uVar17 != uVar16);
    }
    uVar14 = iVar13 * (fx->d).bd;
    uVar17 = (ulong)uVar14;
    if (uVar14 == iVar15 * local_68.d.bd) {
      pfVar5 = fx->v;
      uVar16 = uVar17;
      if ((((ulong)pfVar5 & 3) == 0) &&
         (uVar16 = (ulong)(-((uint)((ulong)pfVar5 >> 2) & 0x3fffffff) & 3), uVar17 <= uVar16)) {
        uVar16 = uVar17;
      }
      pfVar6 = pTVar4->v;
      uVar19 = uVar17 - uVar16;
      uVar18 = uVar19 + 3;
      if (-1 < (long)uVar19) {
        uVar18 = uVar19;
      }
      if (uVar16 != 0) {
        uVar20 = 0;
        do {
          pfVar5[uVar20] = pfVar6[uVar20] + local_68.v[uVar20];
          uVar20 = uVar20 + 1;
        } while (uVar16 != uVar20);
      }
      uVar18 = (uVar18 & 0xfffffffffffffffc) + uVar16;
      if (3 < (long)uVar19) {
        do {
          pfVar1 = pfVar6 + uVar16;
          fVar7 = pfVar1[1];
          fVar8 = pfVar1[2];
          fVar9 = pfVar1[3];
          pfVar2 = local_68.v + uVar16;
          fVar10 = pfVar2[1];
          fVar11 = pfVar2[2];
          fVar12 = pfVar2[3];
          pfVar3 = pfVar5 + uVar16;
          *pfVar3 = *pfVar2 + *pfVar1;
          pfVar3[1] = fVar10 + fVar7;
          pfVar3[2] = fVar11 + fVar8;
          pfVar3[3] = fVar12 + fVar9;
          uVar16 = uVar16 + 4;
        } while ((long)uVar16 < (long)uVar18);
      }
      if ((long)uVar18 < (long)uVar17) {
        do {
          pfVar5[uVar18] = pfVar6[uVar18] + local_68.v[uVar18];
          uVar18 = uVar18 + 1;
        } while (uVar17 != uVar18);
      }
      std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_68.bs);
      return;
    }
    __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                  "void Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
                 );
  }
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<float>, Lhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>, Rhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
               );
}

Assistant:

void GaussianNoise::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("GaussianNoise not yet implemented for CUDA");
#else
  Tensor m(dim, (float*)aux_mem);
  TensorTools::RandomizeNormal(0, stddev, m);
  fx.vec() = xs[0]->vec() + m.vec();
#endif
}